

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void av1_set_mv_search_range(FullMvLimits *mv_limits,MV *mv)

{
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int row_max;
  int col_max;
  int row_min;
  int col_min;
  MV *mv_local;
  FullMvLimits *mv_limits_local;
  
  local_24 = (mv->col + 7 >> 3) + -0x3ff;
  local_28 = (mv->row + 7 >> 3) + -0x3ff;
  local_2c = ((int)mv->col >> 3) + 0x3ff;
  local_30 = ((int)mv->row >> 3) + 0x3ff;
  if (local_24 < -0x7fe) {
    local_24 = -0x7ff;
  }
  if (local_28 < -0x7fe) {
    local_28 = -0x7ff;
  }
  if (0x7fe < local_2c) {
    local_2c = 0x7ff;
  }
  if (0x7fe < local_30) {
    local_30 = 0x7ff;
  }
  if (local_24 < mv_limits->col_min) {
    local_34 = mv_limits->col_min;
  }
  else {
    local_34 = local_24;
  }
  mv_limits->col_min = local_34;
  if (mv_limits->col_max < local_2c) {
    local_38 = mv_limits->col_max;
  }
  else {
    local_38 = local_2c;
  }
  mv_limits->col_max = local_38;
  if (local_28 < mv_limits->row_min) {
    local_3c = mv_limits->row_min;
  }
  else {
    local_3c = local_28;
  }
  mv_limits->row_min = local_3c;
  if (mv_limits->row_max < local_30) {
    local_40 = mv_limits->row_max;
  }
  else {
    local_40 = local_30;
  }
  mv_limits->row_max = local_40;
  if (mv_limits->col_max < mv_limits->col_min) {
    local_44 = mv_limits->col_min;
  }
  else {
    local_44 = mv_limits->col_max;
  }
  mv_limits->col_max = local_44;
  if (mv_limits->row_max < mv_limits->row_min) {
    local_48 = mv_limits->row_min;
  }
  else {
    local_48 = mv_limits->row_max;
  }
  mv_limits->row_max = local_48;
  return;
}

Assistant:

void av1_set_mv_search_range(FullMvLimits *mv_limits, const MV *mv) {
  // Calculate the outermost full-pixel MVs which are inside the limits set by
  // av1_set_subpel_mv_search_range().
  //
  // The subpel limits are simply mv->col +/- 8*MAX_FULL_PEL_VAL, and similar
  // for mv->row. We can then divide by 8 to find the fullpel MV limits. But
  // we have to be careful about the rounding. We want these bounds to be
  // at least as tight as the subpel limits, which means that we must round
  // the minimum values up and the maximum values down when dividing.
  int col_min = ((mv->col + 7) >> 3) - MAX_FULL_PEL_VAL;
  int row_min = ((mv->row + 7) >> 3) - MAX_FULL_PEL_VAL;
  int col_max = (mv->col >> 3) + MAX_FULL_PEL_VAL;
  int row_max = (mv->row >> 3) + MAX_FULL_PEL_VAL;

  col_min = AOMMAX(col_min, (MV_LOW >> 3) + 1);
  row_min = AOMMAX(row_min, (MV_LOW >> 3) + 1);
  col_max = AOMMIN(col_max, (MV_UPP >> 3) - 1);
  row_max = AOMMIN(row_max, (MV_UPP >> 3) - 1);

  // Get intersection of UMV window and valid MV window to reduce # of checks
  // in diamond search.
  mv_limits->col_min = AOMMAX(mv_limits->col_min, col_min);
  mv_limits->col_max = AOMMIN(mv_limits->col_max, col_max);
  mv_limits->row_min = AOMMAX(mv_limits->row_min, row_min);
  mv_limits->row_max = AOMMIN(mv_limits->row_max, row_max);

  mv_limits->col_max = AOMMAX(mv_limits->col_min, mv_limits->col_max);
  mv_limits->row_max = AOMMAX(mv_limits->row_min, mv_limits->row_max);
}